

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-square.c
# Opt level: O2

void square_destroy_decoy(chunk_conflict *c,loc grid)

{
  _Bool _Var1;
  trap_kind_conflict *ptVar2;
  loc lVar3;
  
  ptVar2 = lookup_trap("decoy");
  if (ptVar2 == (trap_kind_conflict *)0x0) {
    __assert_fail("decoy_kind",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/cave-square.c"
                  ,0x69d,"void square_destroy_decoy(struct chunk *, struct loc)");
  }
  square_remove_all_traps_of_type((chunk *)c,grid,ptVar2->tidx);
  lVar3 = (loc)loc(0,0);
  c->decoy = lVar3;
  _Var1 = los(c,player->grid,(loc_conflict)grid);
  if ((_Var1) && (player->timed[2] == 0)) {
    msg("The decoy is destroyed!");
    return;
  }
  return;
}

Assistant:

void square_destroy_decoy(struct chunk *c, struct loc grid)
{
	struct trap_kind *decoy_kind = lookup_trap("decoy");

	assert(decoy_kind);
	square_remove_all_traps_of_type(c, grid, decoy_kind->tidx);
	c->decoy = loc(0, 0);
	if (los(c, player->grid, grid) && !player->timed[TMD_BLIND]){
		msg("The decoy is destroyed!");
	}
}